

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

float __thiscall blinnPhong::pdf(blinnPhong *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  Material *pMVar5;
  float *pfVar6;
  Vector3f *pVVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float local_114;
  double local_110;
  float local_108;
  float local_100;
  float specular_pdf;
  float specular_norm;
  float i;
  float A;
  float T;
  undefined1 local_c0 [3];
  bool even;
  float c;
  float local_b4;
  float local_b0;
  float d;
  float S;
  undefined1 local_a0 [12];
  Ray local_94;
  Ray local_7c;
  undefined1 local_64 [8];
  Vector3f ref_dir;
  float diffuse_pdf;
  float prob_spec;
  Vector3f spec;
  Vector3f diff;
  float shininess;
  Hit *h_local;
  Vector3f *dir_local;
  Ray *ray_local;
  blinnPhong *this_local;
  
  pMVar5 = Hit::getMaterial(h);
  pfVar6 = Material::getShininess(pMVar5);
  fVar1 = *pfVar6;
  pMVar5 = Hit::getMaterial(h);
  pVVar7 = Material::getDiffuseColor(pMVar5);
  Vector3f::Vector3f((Vector3f *)(spec.m_elements + 1),pVVar7);
  pMVar5 = Hit::getMaterial(h);
  pVVar7 = Material::getSpecularColor(pMVar5);
  Vector3f::Vector3f((Vector3f *)&diffuse_pdf,pVVar7);
  pfVar6 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),0);
  fVar8 = *pfVar6;
  pfVar6 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),1);
  fVar9 = *pfVar6;
  pfVar6 = Vector3f::operator[]((Vector3f *)(spec.m_elements + 1),2);
  fVar10 = *pfVar6;
  pfVar6 = Vector3f::operator[]((Vector3f *)&diffuse_pdf,0);
  fVar2 = *pfVar6;
  pfVar6 = Vector3f::operator[]((Vector3f *)&diffuse_pdf,1);
  fVar3 = *pfVar6;
  pfVar6 = Vector3f::operator[]((Vector3f *)&diffuse_pdf,2);
  fVar8 = 1.0 / ((fVar8 + fVar9 + fVar10) / (fVar2 + fVar3 + *pfVar6) + 1.0);
  Hit::getNormal((Hit *)(ref_dir.m_elements + 1));
  local_100 = Vector3f::dot(dir,(Vector3f *)(ref_dir.m_elements + 1));
  local_100 = local_100 / 3.1415927;
  if (local_100 <= 0.0) {
    local_100 = 0.0;
  }
  Ray::getDirection(&local_7c);
  Ray::getDirection((Ray *)(local_a0 + 0xc));
  Hit::getNormal((Hit *)local_a0);
  fVar9 = Vector3f::dot((Vector3f *)(local_a0 + 0xc),(Vector3f *)local_a0);
  Hit::getNormal((Hit *)&d);
  ::operator*(fVar9 * 2.0,&local_94._direction);
  ::operator-(&local_7c._direction,&local_7c._origin);
  Vector3f::normalized((Vector3f *)local_64);
  local_b0 = 0.0;
  Hit::getNormal((Hit *)local_c0);
  local_b4 = Vector3f::dot((Vector3f *)local_64,(Vector3f *)local_c0);
  dVar11 = sqrt((double)(-local_b4 * local_b4 + 1.0));
  fVar9 = (float)dVar11;
  dVar11 = fmod((double)fVar1,2.0);
  bVar4 = dVar11 == 0.0;
  if (bVar4) {
    local_108 = fVar9 * 2.0;
  }
  else {
    local_108 = 3.1415927;
  }
  i = local_108;
  if (bVar4) {
    dVar11 = acos((double)local_b4);
    local_110 = (3.141592653589793 - dVar11) * 2.0;
  }
  else {
    local_110 = 3.1415927410125732;
  }
  for (specular_pdf = (float)bVar4; specular_pdf <= fVar1 - 1.0; specular_pdf = specular_pdf + 2.0)
  {
    local_b0 = local_b0 + i;
    i = (i * fVar9 * fVar9 * (specular_pdf + 1.0)) / (specular_pdf + 2.0);
  }
  fVar9 = local_b4 * local_b0;
  fVar10 = Vector3f::dot((Vector3f *)local_64,dir);
  dVar11 = pow((double)fVar10,(double)fVar1);
  local_114 = (float)(dVar11 / (double)((fVar9 + (float)local_110) / (fVar1 + 1.0)));
  if (local_114 <= 0.0) {
    local_114 = 0.0;
  }
  return fVar8 * local_114 + (1.0 - fVar8) * local_100;
}

Assistant:

float blinnPhong::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float diffuse_pdf = Vector3f::dot(dir, h.getNormal()) / M_PI;
    diffuse_pdf = diffuse_pdf > 0 ? diffuse_pdf : 0;


    Vector3f ref_dir = (ray.getDirection() - 2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
    float S = 0;
    float d = Vector3f::dot(ref_dir, h.getNormal());
    float c = sqrt(1-d*d);
    bool even = fmod(shininess, 2.) == 0.;
    float T = even ? 2.f*c : (float)M_PI;
    float A = even ? (float)2*(M_PI-acos(d)) : (float)M_PI;
    float i = even ? 1 : 0;

    while (i <= shininess-1) {
        S = S+T;
        T = T*c*c*(i+1.)/(i+2.);
        i = i+2;
    }

    float specular_norm = (A + d*(S)) / (shininess+1);
    float specular_pdf = pow(Vector3f::dot(ref_dir, dir), shininess) / specular_norm;
    specular_pdf = specular_pdf > 0 ? specular_pdf : 0;

    return prob_spec * specular_pdf + (1-prob_spec) * diffuse_pdf;

}